

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_gnu_index.c
# Opt level: O2

void dwarf_gnu_index_dealloc(Dwarf_Gnu_Index_Head head)

{
  Dwarf_Debug dbg;
  
  if (((head != (Dwarf_Gnu_Index_Head)0x0) && (dbg = head->gi_dbg, dbg != (Dwarf_Debug)0x0)) &&
     (dbg->de_magic == 0xebfdebfd)) {
    _dwarf_free_gnu_index_head_content(head);
    dwarf_dealloc(dbg,head,0x35);
    return;
  }
  return;
}

Assistant:

void
dwarf_gnu_index_dealloc(Dwarf_Gnu_Index_Head head)
{
    Dwarf_Debug dbg = 0;
    if (!head) {
        return;
    }
    dbg = head->gi_dbg;
    if (IS_INVALID_DBG(dbg)) {
        return;
    }
    _dwarf_free_gnu_index_head_content(head);
    dwarf_dealloc(dbg,head,DW_DLA_GNU_INDEX_HEAD);
}